

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

option_result * __thiscall
argagg::option_result::as<std::__cxx11::string>
          (option_result *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  option_result *this_local;
  
  if (*(long *)t == 0) {
    std::__cxx11::string::string((string *)this,in_RDX);
  }
  else {
    convert::arg<std::__cxx11::string>((convert *)this,*(char **)t);
  }
  return this;
}

Assistant:

T option_result::as(const T& t) const
{
  if (this->arg) {
    try {
      return convert::arg<T>(this->arg);
    } catch (...) {
      return t;
    }
  } else {
    // I actually think this will never happen. To call this method you have
    // to access a specific option_result for an option. If there's a
    // specific option_result then the option was found. If the option
    // requires an argument then it will definitely have an argument
    // otherwise the parser would have complained.
    return t;
  }
}